

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusinputcontextproxy.h
# Opt level: O0

QDBusPendingReply<> * __thiscall QIBusInputContextProxy::Destroy(QIBusInputContextProxy *this)

{
  QList_conflict *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QList<QVariant> argumentList;
  DataPointer *in_stack_ffffffffffffff38;
  QArrayDataPointer<char16_t> local_60 [2];
  QDBusPendingCall local_30 [8];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaaaaaaaaaa;
  QList<QVariant>::QList((QList<QVariant> *)0x10e210);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_60,(Data *)0x0,L"Destroy",7);
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffff38);
  QDBusAbstractInterface::asyncCallWithArgumentList((QString *)local_30,in_RSI);
  QDBusPendingReply<>::QDBusPendingReply
            ((QDBusPendingReply<> *)in_RDI,(QDBusPendingCall *)in_stack_ffffffffffffff38);
  QDBusPendingCall::~QDBusPendingCall(local_30);
  QString::~QString((QString *)0x10e2a3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  QList<QVariant>::~QList((QList<QVariant> *)0x10e2b7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusPendingReply<> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusPendingReply<> Destroy()
    {
        QList<QVariant> argumentList;
        return asyncCallWithArgumentList(QStringLiteral("Destroy"), argumentList);
    }